

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

bool __thiscall wallet::SQLiteBatch::ReadKey(SQLiteBatch *this,DataStream *key,DataStream *value)

{
  wallet *this_00;
  bool bVar1;
  int iVar2;
  string *in_R9;
  pointer pbVar3;
  pointer __n;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar4;
  string_view logging_function;
  string_view source_file;
  allocator<char> local_59;
  undefined8 local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_database->m_db != (sqlite3 *)0x0) {
    this_00 = (wallet *)this->m_read_stmt;
    if (this_00 == (wallet *)0x0) {
      __assert_fail("m_read_stmt",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x1cc,"virtual bool wallet::SQLiteBatch::ReadKey(DataStream &&, DataStream &)")
      ;
    }
    pbVar3 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start + key->m_read_pos;
    __n = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish + -(long)pbVar3;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"key",&local_59);
    SVar4.m_size = (size_t)local_58;
    SVar4.m_data = __n;
    bVar1 = BindBlobToStatement(this_00,(sqlite3_stmt *)0x1,(int)pbVar3,SVar4,in_R9);
    std::__cxx11::string::~string((string *)local_58);
    if (bVar1) {
      iVar2 = sqlite3_step(this->m_read_stmt);
      if (iVar2 == 100) {
        pbVar3 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_finish != pbVar3) {
          (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = pbVar3;
        }
        value->m_read_pos = 0;
        SVar4 = SpanFromBlob(this->m_read_stmt,0);
        DataStream::write(value,(int)SVar4.m_data,(void *)SVar4.m_size,(size_t)__n);
        bVar1 = true;
      }
      else {
        if (iVar2 != 0x65) {
          local_58[0] = sqlite3_errstr(iVar2);
          logging_function._M_str = "ReadKey";
          logging_function._M_len = 7;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
          ;
          source_file._M_len = 0x61;
          LogPrintFormatInternal<char[8],char_const*>
                    (logging_function,source_file,0x1d4,ALL,Info,(ConstevalFormatString<2U>)0x3f2a66
                     ,(char (*) [8])"ReadKey",(char **)local_58);
        }
        bVar1 = false;
      }
      sqlite3_clear_bindings(this->m_read_stmt);
      sqlite3_reset(this->m_read_stmt);
      goto LAB_001ae69c;
    }
  }
  bVar1 = false;
LAB_001ae69c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::ReadKey(DataStream&& key, DataStream& value)
{
    if (!m_database.m_db) return false;
    assert(m_read_stmt);

    // Bind: leftmost parameter in statement is index 1
    if (!BindBlobToStatement(m_read_stmt, 1, key, "key")) return false;
    int res = sqlite3_step(m_read_stmt);
    if (res != SQLITE_ROW) {
        if (res != SQLITE_DONE) {
            // SQLITE_DONE means "not found", don't log an error in that case.
            LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
        }
        sqlite3_clear_bindings(m_read_stmt);
        sqlite3_reset(m_read_stmt);
        return false;
    }
    // Leftmost column in result is index 0
    value.clear();
    value.write(SpanFromBlob(m_read_stmt, 0));

    sqlite3_clear_bindings(m_read_stmt);
    sqlite3_reset(m_read_stmt);
    return true;
}